

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_get_max_channel_count(cubeb_conflict *ctx,uint32_t *max_channels)

{
  if (ctx->default_sink_info != (cubeb_default_sink_info *)0x0) {
    *max_channels = (uint)(ctx->default_sink_info->channel_map).channels;
    return 0;
  }
  return -1;
}

Assistant:

static int
pulse_get_max_channel_count(cubeb * ctx, uint32_t * max_channels)
{
  (void)ctx;
  assert(ctx && max_channels);

  if (!ctx->default_sink_info)
    return CUBEB_ERROR;

  *max_channels = ctx->default_sink_info->channel_map.channels;

  return CUBEB_OK;
}